

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ContiguousMemoryRange __thiscall
protozero::StaticBufferDelegate::GetNewBuffer(StaticBufferDelegate *this)

{
  uint uVar1;
  code *pcVar2;
  char *fname;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  StaticBufferDelegate *this_local;
  
  if ((this->get_new_buffer_called_once_ & 1U) != 0) {
    fname = perfetto::base::Basename
                      (
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    perfetto::base::LogMessage
              (kLogError,fname,0x2a07,"Static buffer too small (errno: %d, %s)",(ulong)uVar1,pcVar5)
    ;
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  this->get_new_buffer_called_once_ = true;
  return this->range_;
}

Assistant:

ContiguousMemoryRange StaticBufferDelegate::GetNewBuffer() {
  if (get_new_buffer_called_once_) {
    // This is the 2nd time GetNewBuffer is called. The estimate is wrong. We
    // shouldn't try to grow the buffer after the initial call.
    PERFETTO_FATAL("Static buffer too small");
  }
  get_new_buffer_called_once_ = true;
  return range_;
}